

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowChildOf(ImGuiWindow *window,ImGuiWindow *potential_parent,bool popup_hierarchy)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  
  pIVar1 = window;
  pIVar2 = window;
  if (window != (ImGuiWindow *)0x0) {
    do {
      pIVar2 = pIVar1->RootWindow;
      if (popup_hierarchy) {
        pIVar2 = pIVar2->RootWindowPopupTree;
      }
      bVar3 = pIVar1 != pIVar2;
      pIVar1 = pIVar2;
    } while (bVar3);
  }
  if (pIVar2 != potential_parent) {
    if (window == (ImGuiWindow *)0x0) {
      return false;
    }
    while( true ) {
      bVar3 = window == potential_parent;
      if (bVar3) {
        return bVar3;
      }
      if (window == pIVar2) break;
      window = window->ParentWindow;
      if (window == (ImGuiWindow *)0x0) {
        return bVar3;
      }
    }
    return bVar3;
  }
  return true;
}

Assistant:

bool ImGui::IsWindowChildOf(ImGuiWindow* window, ImGuiWindow* potential_parent, bool popup_hierarchy)
{
    ImGuiWindow* window_root = GetCombinedRootWindow(window, popup_hierarchy);
    if (window_root == potential_parent)
        return true;
    while (window != NULL)
    {
        if (window == potential_parent)
            return true;
        if (window == window_root) // end of chain
            return false;
        window = window->ParentWindow;
    }
    return false;
}